

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O2

void __thiscall
Eigen::EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::doComputeEigenvectors
          (EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this)

{
  MatrixType *xpr;
  double dVar1;
  Scalar SVar2;
  undefined1 auVar3 [16];
  double dVar4;
  Scalar SVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double i;
  long lVar11;
  Index j;
  long lVar12;
  double dVar13;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  ReturnType RVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  Scalar q;
  double local_1d8;
  Scalar lastw;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  long local_188;
  Scalar t;
  double local_158;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> local_150;
  EigenvalueType *local_130;
  Scalar w;
  variable_if_dynamic<long,__1> local_118;
  PointerType pdStack_110;
  Nested local_100;
  Index IStack_f8;
  Index local_f0;
  Scalar vr;
  variable_if_dynamic<long,__1> local_d8;
  PointerType pdStack_d0;
  Nested local_c0;
  Index IStack_b8;
  Index local_b0;
  double local_68;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  xpr = &this->m_matT;
  dVar18 = 0.0;
  for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
    Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>::Block
              ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,xpr,lVar12);
    VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,__1> *)
               &w,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,0,2);
    vr = w;
    local_d8.m_value = local_118.m_value;
    pdStack_d0 = pdStack_110;
    local_c0 = local_100;
    IStack_b8 = IStack_f8;
    local_b0 = local_f0;
    SVar2 = DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,_-1,_false>_>_>
            ::sum((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_1,__1,_false>_>_>
                   *)&vr);
    dVar18 = dVar18 + SVar2;
  }
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_130 = &this->m_eivalues;
    i = 4.94065645841247e-324;
    while (-1 < (long)i) {
      dVar1 = *(double *)
               (local_130->
               super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>).m_storage
               .m_data.array[(long)i]._M_value;
      q = *(Scalar *)
           ((local_130->super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>).
            m_storage.m_data.array[(long)i]._M_value + 8);
      if ((q == 0.0) && (!NAN(q))) {
        (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
        [(long)i * 3] = 1.0;
        dVar13 = i;
        dVar24 = 0.0;
        uVar26 = 0;
        RVar25 = 0.0;
        uVar27 = 0;
        do {
          lVar7 = ((long)i - (long)dVar13) + 1;
          lVar10 = (long)dVar13 * 0x10 + 0x20;
          uVar14 = SUB84(RVar25,0);
          uVar16 = (undefined4)((ulong)RVar25 >> 0x20);
          uVar15 = (undefined4)uVar27;
          uVar17 = (undefined4)((ulong)uVar27 >> 0x20);
          lVar12 = (long)i * 2 + 0x20 + (long)dVar13;
          lVar11 = (long)dVar13 * 0xc + 0x88;
          local_1d8 = dVar13;
          do {
            lVar9 = lVar11;
            lVar8 = lVar12;
            dVar19 = i;
            if ((long)dVar13 < 1) goto LAB_0015e0db;
            local_1b8 = (double)CONCAT44(uVar16,uVar14);
            uStack_1b0 = CONCAT44(uVar17,uVar15);
            dVar13 = (double)((long)dVar13 + -1);
            local_198._8_8_ = 0;
            local_198._0_8_ =
                 *(double *)
                  ((long)(this->m_eivec).
                         super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                         m_data.array + lVar9 * 2 + -0x28) - dVar1;
            local_1c8 = dVar24;
            uStack_1c0 = uVar26;
            Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>::Block
                      ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,xpr,
                       (Index)dVar13);
            dVar24 = local_1d8;
            VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_-1>::
            VectorBlock((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,__1>
                         *)&vr,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,
                        (Index)local_1d8,lVar7);
            Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block(&local_150,xpr,(Index)i);
            VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1>::
            VectorBlock((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1>
                         *)&w,&local_150,(Index)dVar24,lVar7);
            RVar25 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                     ::
                     dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                               ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,_1,false>>
                                 *)&vr,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                        *)&w);
            uVar14 = SUB84(RVar25,0);
            uVar16 = (undefined4)((ulong)RVar25 >> 0x20);
            dVar19 = *(double *)
                      ((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + lVar10 + -8);
            lVar10 = lVar10 + -0x10;
            lVar12 = lVar8 + -1;
            lVar11 = lVar9 + -0xc;
            uVar15 = extraout_XMM0_Dc;
            uVar17 = extraout_XMM0_Dd;
            dVar24 = (double)local_198._0_8_;
            uVar26 = local_198._8_8_;
          } while (dVar19 < 0.0);
          if ((dVar19 != 0.0) || (NAN(dVar19))) {
            dVar24 = *(double *)((long)(&this->m_eivec + -1) + lVar9 * 2);
            dVar20 = *(double *)
                      ((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + lVar9 * 2 + -0x18);
            dVar23 = *(double *)
                      ((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + lVar10) - dVar1;
            dVar19 = (dVar20 * local_1b8 - RVar25 * local_1c8) / (dVar23 * dVar23 + dVar19 * dVar19)
            ;
            (this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[lVar8 + -1] = dVar19;
            if (ABS(dVar20) <= ABS(local_1c8)) {
              (this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
              .m_data.array[lVar8] = (-dVar24 * dVar19 - local_1b8) / local_1c8;
            }
            else {
              (this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
              .m_data.array[lVar8] = (-(double)local_198._0_8_ * dVar19 - RVar25) / dVar20;
            }
          }
          else {
            dVar19 = (double)local_198._0_8_;
            if (((double)local_198._0_8_ == 0.0) && (!NAN((double)local_198._0_8_))) {
              dVar19 = dVar18 * 2.220446049250313e-16;
            }
            dVar19 = -RVar25 / dVar19;
            (this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
            m_data.array[lVar8 + -1] = dVar19;
          }
          t = ABS(dVar19);
          dVar24 = local_1c8;
          uVar26 = uStack_1c0;
          RVar25 = local_1b8;
          uVar27 = uStack_1b0;
          if (1.0 < t * 2.220446049250313e-16 * t) {
            Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)&w,xpr,(Index)i);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_>::tail
                      ((SegmentReturnType *)&vr,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>_> *
                       )&w,2 - (long)dVar13);
            DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
            ::operator/=((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                          *)&vr,&t);
            dVar24 = local_1c8;
            uVar26 = uStack_1c0;
            RVar25 = local_1b8;
            uVar27 = uStack_1b0;
          }
        } while( true );
      }
      if ((i == 0.0) || (0.0 <= q)) {
        __assert_fail("0 && \"Internal bug in EigenSolver\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Eigenvalues/EigenSolver.h"
                      ,0x251,
                      "void Eigen::EigenSolver<Eigen::Matrix<double, 2, 2>>::doComputeEigenvectors() [_MatrixType = Eigen::Matrix<double, 2, 2>]"
                     );
      }
      lastw = 0.0;
      dVar19 = (double)((long)i + -1);
      auVar22 = *(undefined1 (*) [16])
                 ((xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                  m_data.array + (long)i * 3 + -2);
      dVar13 = SUB168(auVar22 & _DAT_0016a3f0,0);
      if (dVar13 <= SUB168(auVar22 & _DAT_0016a3f0,8)) {
        vr = 0.0;
        w = (Scalar)(auVar22._8_8_ ^ (ulong)DAT_0016a3d0);
        t = (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array[(long)i * 3 + -3] - dVar1;
        cdiv<double>(&vr,&w,&t,&q);
        (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
        [(long)i * 3 + -3] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
      else {
        (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
        [(long)i * 3 + -3] = q / auVar22._0_8_;
        dVar13 = -((xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                   m_data.array[(long)i * 3] - dVar1) / auVar22._0_8_;
      }
      (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
      [(long)i * 3 + -1] = dVar13;
      (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
      [(long)i * 3 + -2] = 0.0;
      (xpr->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
      [(long)i * 3] = 1.0;
      lVar11 = (long)i * 0x18 + 0xe0;
      local_188 = 4 - (long)i;
      dVar24 = 0.0;
      RVar25 = 0.0;
      lVar12 = lVar11;
      local_1d8 = (double)((long)i * 0x10);
      local_1a8 = dVar19;
      for (dVar13 = (double)((long)i + -2); -1 < (long)dVar13; dVar13 = (double)((long)dVar13 + -1))
      {
        local_1c8 = dVar24;
        local_1b8 = RVar25;
        Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>::Block
                  ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,xpr,(Index)dVar13)
        ;
        dVar20 = local_1a8;
        lVar7 = ((long)i - (long)local_1a8) + 1;
        VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_-1>::
        VectorBlock((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,__1>
                     *)&vr,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,
                    (Index)local_1a8,lVar7);
        Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block(&local_150,xpr,(Index)dVar19)
        ;
        VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1>
                    *)&w,&local_150,(Index)dVar20,lVar7);
        RVar25 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                 ::
                 dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                           ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,_1,false>>
                             *)&vr,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                    *)&w);
        local_198._8_4_ = extraout_XMM0_Dc_00;
        local_198._0_8_ = RVar25;
        local_198._12_4_ = extraout_XMM0_Dd_00;
        Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>::Block
                  ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,xpr,(Index)dVar13)
        ;
        VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,_-1>::
        VectorBlock((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false>,__1>
                     *)&vr,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_1,_2,_false> *)&t,
                    (Index)dVar20,lVar7);
        Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block(&local_150,xpr,(Index)i);
        VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1>
                    *)&w,&local_150,(Index)dVar20,lVar7);
        RVar25 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,-1,false>>
                 ::
                 dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                           ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,1,2,false>,1,_1,false>>
                             *)&vr,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                                    *)&w);
        dVar23 = local_1d8;
        w = *(double *)
             ((long)(this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array + lVar12 + -0x10) - dVar1;
        dVar20 = *(double *)
                  ((long)(this->m_eivec).
                         super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                         m_data.array + (long)local_1d8 + 8);
        dVar4 = (double)local_198._0_8_;
        SVar5 = w;
        dVar6 = local_1a8;
        if (0.0 <= dVar20) {
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            local_48 = *(double *)
                        ((long)(this->m_eivec).
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                               m_storage.m_data.array + lVar12 + -8);
            local_58 = *(double *)
                        ((long)(this->m_eivec).
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                               m_storage.m_data.array + lVar12);
            dVar24 = *(double *)
                      ((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + (long)local_1d8) - dVar1;
            vr = (dVar24 * dVar24 + dVar20 * dVar20) - q * q;
            t = (dVar24 + dVar24) * q;
            uStack_40 = 0;
            if ((vr != 0.0) || (((NAN(vr) || (t != 0.0)) || (NAN(t))))) {
              local_1a8 = ABS(local_58);
            }
            else {
              local_1a8 = ABS(local_58);
              vr = (ABS(lastw) + ABS(local_48) + local_1a8 + ABS(q) + ABS(w)) *
                   dVar18 * 2.220446049250313e-16;
            }
            uStack_1a0 = 0;
            local_150.
            super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.m_data
                 = (PointerType)
                   (q * RVar25 + (local_58 * local_1c8 - (double)local_198._0_8_ * lastw));
            dVar20 = (local_58 * local_1b8 - RVar25 * lastw) + -q * (double)local_198._0_8_;
            uStack_50 = 0;
            local_158 = dVar20;
            local_68 = RVar25;
            cdiv<double>((double *)&local_150,&local_158,&vr,&t);
            *(ulong *)((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + lVar11) =
                 CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
            *(double *)
             ((long)(this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array + lVar11 + 0x10) = dVar20;
            if (local_1a8 <= ABS(q) + ABS(lastw)) {
              local_150.
              super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.
              m_data = (PointerType)
                       ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * -local_48 -
                       local_1c8);
              local_158 = -local_48 * dVar20 - local_1b8;
              cdiv<double>((double *)&local_150,&local_158,&lastw,&q);
              uVar26 = *(undefined8 *)
                        ((long)(this->m_eivec).
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                               m_storage.m_data.array + lVar11);
              uVar15 = (undefined4)uVar26;
              uVar17 = (undefined4)((ulong)uVar26 >> 0x20);
              dVar24 = *(double *)
                        ((long)(this->m_eivec).
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                               m_storage.m_data.array + lVar11 + 0x10);
              auVar22._12_4_ = extraout_XMM0_Db_02;
              auVar22._8_4_ = extraout_XMM0_Da_02;
              auVar22._0_8_ = dVar20;
            }
            else {
              auVar21._0_8_ =
                   (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * -q +
                   (dVar20 * -w - local_68);
              auVar21._8_8_ =
                   dVar20 * q +
                   ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * -w -
                   (double)local_198._0_8_);
              auVar3._8_4_ = SUB84(local_58,0);
              auVar3._0_8_ = local_58;
              auVar3._12_4_ = (int)((ulong)local_58 >> 0x20);
              auVar22 = divpd(auVar21,auVar3);
              uVar15 = extraout_XMM0_Da_01;
              uVar17 = extraout_XMM0_Db_01;
              dVar24 = dVar20;
            }
            *(long *)((long)(this->m_eivec).
                            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                            m_data.array + lVar11 + 8) = auVar22._8_8_;
            *(long *)((long)(this->m_eivec).
                            super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                            m_data.array + lVar11 + 0x18) = auVar22._0_8_;
          }
          else {
            vr = -(double)local_198._0_8_;
            t = -RVar25;
            cdiv<double>(&vr,&t,&w,&q);
            *(ulong *)((long)(this->m_eivec).
                             super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                             m_data.array + lVar11) =
                 CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
            *(double *)
             ((long)(this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array + lVar11 + 0x10) = dVar24;
            uVar15 = extraout_XMM0_Da_00;
            uVar17 = extraout_XMM0_Db_00;
          }
          t = ABS(dVar24);
          if (ABS(dVar24) <= ABS((double)CONCAT44(uVar17,uVar15))) {
            t = ABS((double)CONCAT44(uVar17,uVar15));
          }
          RVar25 = local_1b8;
          dVar4 = local_1c8;
          SVar5 = lastw;
          dVar6 = dVar13;
          if (1.0 < t * 2.220446049250313e-16 * t) {
            Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>::Block
                      ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)&vr,xpr,
                       (Index)dVar13,(Index)dVar19,local_188,2);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::
            operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_>
                        *)&vr,&t);
            RVar25 = local_1b8;
            dVar4 = local_1c8;
            SVar5 = lastw;
          }
        }
        local_1a8 = dVar6;
        lastw = SVar5;
        dVar24 = dVar4;
        lVar11 = lVar11 + -8;
        lVar12 = lVar12 + -0x18;
        local_1d8 = (double)((long)dVar23 + -0x10);
        local_188 = local_188 + 1;
      }
LAB_0015e0db:
      i = (double)((long)dVar19 + -1);
    }
    for (lVar12 = 1; -1 < lVar12; lVar12 = lVar12 + -1) {
      DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::leftCols
                ((ColsBlockXpr *)&t,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this,
                 lVar12 + 1);
      Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block(&local_150,xpr,lVar12);
      VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1> *)
                 &w,&local_150,0,lVar12 + 1);
      CoeffBasedProduct<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,-1,1,false>const,6>
      ::
      CoeffBasedProduct<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
                ((CoeffBasedProduct<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const,6>
                  *)&vr,(ColsBlockXpr *)&t,
                 (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                  *)&w);
      PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
      lazyAssign<Eigen::CoeffBasedProduct<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const,6>>
                ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&this->m_tmp,
                 (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>_>
                  *)&vr);
      Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true> *)&vr,&this->m_eivec,
                 lVar12);
      dVar18 = (this->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
               m_data.array[1];
      *(double *)vr =
           (this->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
           m_data.array[0];
      *(double *)((long)vr + 8) = dVar18;
    }
  }
  return;
}

Assistant:

void EigenSolver<MatrixType>::doComputeEigenvectors()
{
  using std::abs;
  const Index size = m_eivec.cols();
  const Scalar eps = NumTraits<Scalar>::epsilon();

  // inefficient! this is already computed in RealSchur
  Scalar norm(0);
  for (Index j = 0; j < size; ++j)
  {
    norm += m_matT.row(j).segment((std::max)(j-1,Index(0)), size-(std::max)(j-1,Index(0))).cwiseAbs().sum();
  }
  
  // Backsubstitute to find vectors of upper triangular form
  if (norm == 0.0)
  {
    return;
  }

  for (Index n = size-1; n >= 0; n--)
  {
    Scalar p = m_eivalues.coeff(n).real();
    Scalar q = m_eivalues.coeff(n).imag();

    // Scalar vector
    if (q == Scalar(0))
    {
      Scalar lastr(0), lastw(0);
      Index l = n;

      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-1; i >= 0; i--)
      {
        Scalar w = m_matT.coeff(i,i) - p;
        Scalar r = m_matT.row(i).segment(l,n-l+1).dot(m_matT.col(n).segment(l, n-l+1));

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastr = r;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == 0.0)
          {
            if (w != 0.0)
              m_matT.coeffRef(i,n) = -r / w;
            else
              m_matT.coeffRef(i,n) = -r / (eps * norm);
          }
          else // Solve real equations
          {
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar denom = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag();
            Scalar t = (x * lastr - lastw * r) / denom;
            m_matT.coeffRef(i,n) = t;
            if (abs(x) > abs(lastw))
              m_matT.coeffRef(i+1,n) = (-r - w * t) / x;
            else
              m_matT.coeffRef(i+1,n) = (-lastr - y * t) / lastw;
          }

          // Overflow control
          Scalar t = abs(m_matT.coeff(i,n));
          if ((eps * t) * t > Scalar(1))
            m_matT.col(n).tail(size-i) /= t;
        }
      }
    }
    else if (q < Scalar(0) && n > 0) // Complex vector
    {
      Scalar lastra(0), lastsa(0), lastw(0);
      Index l = n-1;

      // Last vector component imaginary so matrix is triangular
      if (abs(m_matT.coeff(n,n-1)) > abs(m_matT.coeff(n-1,n)))
      {
        m_matT.coeffRef(n-1,n-1) = q / m_matT.coeff(n,n-1);
        m_matT.coeffRef(n-1,n) = -(m_matT.coeff(n,n) - p) / m_matT.coeff(n,n-1);
      }
      else
      {
        std::complex<Scalar> cc = cdiv<Scalar>(0.0,-m_matT.coeff(n-1,n),m_matT.coeff(n-1,n-1)-p,q);
        m_matT.coeffRef(n-1,n-1) = numext::real(cc);
        m_matT.coeffRef(n-1,n) = numext::imag(cc);
      }
      m_matT.coeffRef(n,n-1) = 0.0;
      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-2; i >= 0; i--)
      {
        Scalar ra = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n-1).segment(l, n-l+1));
        Scalar sa = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n).segment(l, n-l+1));
        Scalar w = m_matT.coeff(i,i) - p;

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastra = ra;
          lastsa = sa;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == RealScalar(0))
          {
            std::complex<Scalar> cc = cdiv(-ra,-sa,w,q);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
          }
          else
          {
            // Solve complex equations
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar vr = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag() - q * q;
            Scalar vi = (m_eivalues.coeff(i).real() - p) * Scalar(2) * q;
            if ((vr == 0.0) && (vi == 0.0))
              vr = eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(lastw));

            std::complex<Scalar> cc = cdiv(x*lastra-lastw*ra+q*sa,x*lastsa-lastw*sa-q*ra,vr,vi);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
            if (abs(x) > (abs(lastw) + abs(q)))
            {
              m_matT.coeffRef(i+1,n-1) = (-ra - w * m_matT.coeff(i,n-1) + q * m_matT.coeff(i,n)) / x;
              m_matT.coeffRef(i+1,n) = (-sa - w * m_matT.coeff(i,n) - q * m_matT.coeff(i,n-1)) / x;
            }
            else
            {
              cc = cdiv(-lastra-y*m_matT.coeff(i,n-1),-lastsa-y*m_matT.coeff(i,n),lastw,q);
              m_matT.coeffRef(i+1,n-1) = numext::real(cc);
              m_matT.coeffRef(i+1,n) = numext::imag(cc);
            }
          }

          // Overflow control
          using std::max;
          Scalar t = (max)(abs(m_matT.coeff(i,n-1)),abs(m_matT.coeff(i,n)));
          if ((eps * t) * t > Scalar(1))
            m_matT.block(i, n-1, size-i, 2) /= t;

        }
      }
      
      // We handled a pair of complex conjugate eigenvalues, so need to skip them both
      n--;
    }
    else
    {
      eigen_assert(0 && "Internal bug in EigenSolver"); // this should not happen
    }
  }

  // Back transformation to get eigenvectors of original matrix
  for (Index j = size-1; j >= 0; j--)
  {
    m_tmp.noalias() = m_eivec.leftCols(j+1) * m_matT.col(j).segment(0, j+1);
    m_eivec.col(j) = m_tmp;
  }
}